

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_compression.cc
# Opt level: O3

bool S2DecodePointsCompressed(Decoder *decoder,int level,Span<Vector3<double>_> points)

{
  VType *pVVar1;
  VType VVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uchar *puVar6;
  pointer pFVar7;
  FaceRun *pFVar8;
  uchar *puVar9;
  ulong uVar10;
  VType *pVVar11;
  VType *pVVar12;
  uint uVar13;
  bool bVar14;
  _Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
  *this;
  ulong uVar15;
  uint uVar16;
  undefined4 in_register_00000034;
  int iVar17;
  pointer pFVar18;
  long lVar19;
  pointer pFVar20;
  pointer pFVar21;
  ulong uVar22;
  pointer pVVar23;
  ulong uVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  uint32 zig_zag_encoded_deriv_qi;
  uint32 zig_zag_encoded_deriv_pi;
  uint64 interleaved_zig_zag_encoded_deriv_pi_qi;
  NthDerivativeCoder pi_coder;
  NthDerivativeCoder qi_coder;
  pointer local_d8;
  uint local_c8;
  uint local_c4;
  double local_c0;
  pointer local_b8;
  S2LogMessage local_b0;
  ulong local_a0;
  pointer local_98;
  undefined8 local_90;
  undefined8 local_88;
  uint local_60 [12];
  
  local_98 = points.ptr_;
  local_b8 = (pointer)0x0;
  if ((int)points.len_ < 1) {
    local_d8 = (pointer)0x0;
    dVar26 = (double)CONCAT44(in_register_00000034,level);
    uVar22 = points.len_;
  }
  else {
    pFVar20 = (pointer)0x0;
    pFVar18 = (pointer)0x0;
    local_d8 = (pointer)0x0;
    local_c0 = (double)CONCAT44(in_register_00000034,level);
    pFVar21 = local_b8;
    local_a0 = points.len_;
    do {
      local_b8 = pFVar21;
      puVar9 = decoder->limit_;
      puVar6 = (uchar *)Varint::Parse64WithLimit((char *)decoder->buf_,(char *)puVar9,&local_90);
      if ((puVar6 == (uchar *)0x0) || (decoder->buf_ = puVar6, 2 < (uint)(local_90 >> 0x21))) {
LAB_00204ec4:
        bVar14 = false;
        goto LAB_00204f5e;
      }
      uVar22 = local_90 / 6;
      if ((int)uVar22 < 1) goto LAB_00204ec4;
      uVar24 = local_90 % 6;
      if (pFVar20 == pFVar18) {
        lVar19 = (long)pFVar20 - (long)local_d8;
        if (lVar19 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar10 = lVar19 >> 3;
        uVar15 = uVar10;
        if (pFVar20 == local_d8) {
          uVar15 = 1;
        }
        this = (_Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                *)(uVar15 + uVar10);
        if ((_Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
             *)0xffffffffffffffe < this) {
          this = (_Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                  *)0xfffffffffffffff;
        }
        if (CARRY8(uVar15,uVar10)) {
          this = (_Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                  *)0xfffffffffffffff;
        }
        pFVar7 = std::
                 _Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                 ::_M_allocate(this,(size_t)puVar9);
        *(ulong *)((long)pFVar7 + lVar19) = uVar22 << 0x20 | uVar24;
        pFVar21 = pFVar7;
        for (pFVar8 = local_d8; pFVar20 != pFVar8; pFVar8 = pFVar8 + 1) {
          *pFVar21 = *pFVar8;
          pFVar21 = pFVar21 + 1;
        }
        if (local_d8 != (pointer)0x0) {
          operator_delete(local_d8);
        }
        pFVar18 = pFVar7 + (long)this;
        local_d8 = pFVar7;
      }
      else {
        *pFVar20 = (FaceRun)(uVar22 << 0x20 | uVar24);
        pFVar21 = pFVar20;
      }
      pFVar20 = pFVar21 + 1;
      uVar3 = (int)local_b8 + (int)uVar22;
      dVar26 = local_c0;
      uVar22 = local_a0;
      local_b8 = pFVar20;
      pFVar21 = (pointer)(ulong)uVar3;
    } while ((int)uVar3 < (int)local_a0);
  }
  local_90 = 2;
  local_88 = 0;
  local_60[0] = 2;
  local_60[1] = 0;
  local_60[2] = 0;
  local_60[3] = 0;
  pVVar23 = local_98;
  if (uVar22 != 0) {
    iVar4 = SUB84(dVar26,0) + 7;
    iVar17 = SUB84(dVar26,0) + 0xe;
    if (-1 < iVar4) {
      iVar17 = iVar4;
    }
    uVar15 = (ulong)((iVar17 >> 3) * 2);
    local_b8 = (pointer)((long)local_b8 - (long)local_d8 >> 3);
    local_c0 = (double)(1 << (SUB81(dVar26,0) & 0x1f));
    uVar10 = 0;
    uVar24 = 0;
    do {
      local_a0 = uVar10;
      if (uVar10 == 0) {
        puVar9 = decoder->buf_;
        if (decoder->limit_ < puVar9) {
          S2LogMessage::S2LogMessage
                    (&local_b0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.h"
                     ,0x1a1,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_b0.stream_,"Check failed: (limit_) >= (buf_) ",0x21);
          goto LAB_0020502b;
        }
        if ((ulong)((long)decoder->limit_ - (long)puVar9) < uVar15) goto LAB_00204f5c;
        local_b0._0_8_ = 0;
        memcpy(&local_b0,puVar9,uVar15);
        decoder->buf_ = puVar9 + uVar15;
        util_bits::DeinterleaveUint32(local_b0._0_8_,&local_c4,&local_c8);
        uVar3 = local_90._4_4_;
        if ((int)local_90._4_4_ < (int)local_90) {
          uVar3 = local_90._4_4_ + 1;
          local_90 = CONCAT44(uVar3,(int)local_90);
        }
        uVar5 = local_c4;
        if (0 < (int)uVar3) {
          uVar10 = (ulong)uVar3 + 1;
          do {
            uVar5 = uVar5 + *(int *)((long)&local_90 + uVar10 * 4);
            *(uint *)((long)&local_90 + uVar10 * 4) = uVar5;
            uVar10 = uVar10 - 1;
          } while (1 < uVar10);
        }
        uVar3 = local_60[1];
        if ((int)local_60[1] < (int)local_60[0]) {
          uVar3 = local_60[1] + 1;
          local_60[1] = uVar3;
        }
        pVVar23 = local_98;
        uVar16 = local_c8;
        if (0 < (int)uVar3) {
          uVar10 = (ulong)uVar3 + 1;
          do {
            uVar16 = uVar16 + local_60[uVar10];
            local_60[uVar10] = uVar16;
            uVar10 = uVar10 - 1;
          } while (1 < uVar10);
        }
      }
      else {
        puVar9 = (uchar *)Varint::Parse64WithLimit
                                    ((char *)decoder->buf_,(char *)decoder->limit_,
                                     (uint64 *)&local_b0);
        if (puVar9 == (uchar *)0x0) goto LAB_00204f5c;
        decoder->buf_ = puVar9;
        util_bits::DeinterleaveUint32(local_b0._0_8_,&local_c4,&local_c8);
        uVar3 = local_90._4_4_;
        if ((int)local_90._4_4_ < (int)local_90) {
          uVar3 = local_90._4_4_ + 1;
          local_90 = CONCAT44(uVar3,(int)local_90);
        }
        uVar5 = -(local_c4 & 1) ^ local_c4 >> 1;
        if (0 < (int)uVar3) {
          uVar10 = (ulong)uVar3 + 1;
          do {
            uVar5 = uVar5 + *(int *)((long)&local_90 + uVar10 * 4);
            *(uint *)((long)&local_90 + uVar10 * 4) = uVar5;
            uVar10 = uVar10 - 1;
          } while (1 < uVar10);
        }
        uVar3 = local_60[1];
        if ((int)local_60[1] < (int)local_60[0]) {
          uVar3 = local_60[1] + 1;
          local_60[1] = uVar3;
        }
        uVar16 = -(local_c8 & 1) ^ local_c8 >> 1;
        if (0 < (int)uVar3) {
          uVar10 = (ulong)uVar3 + 1;
          do {
            uVar16 = uVar16 + local_60[uVar10];
            local_60[uVar10] = uVar16;
            uVar10 = uVar10 - 1;
          } while (1 < uVar10);
        }
      }
      uVar3 = (uint)uVar24;
      pFVar18 = (pointer)(long)(int)uVar3;
      if (local_b8 == pFVar18) {
        S2LogMessage::S2LogMessage
                  (&local_b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2point_compression.cc"
                   ,0x9d,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_b0.stream_,"Check failed: (faces_.size()) != (face_index_) ",0x2f);
        goto LAB_0020502b;
      }
      iVar17 = (int)(uVar24 >> 0x20);
      if (local_d8[(long)pFVar18].count < iVar17) {
        S2LogMessage::S2LogMessage
                  (&local_b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2point_compression.cc"
                   ,0x9e,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_b0.stream_,
                   "Check failed: (num_faces_used_for_index_) <= (faces_[face_index_].count) ",0x49)
        ;
        goto LAB_0020502b;
      }
      uVar13 = uVar3 + 1;
      uVar24 = (uVar24 & 0xffffffff00000000) + 0x100000000;
      if (local_d8[(long)pFVar18].count == iVar17) {
        uVar24 = 0x100000000;
        uVar3 = uVar13;
        pFVar18 = (pointer)(long)(int)uVar13;
      }
      dVar26 = ((double)(int)uVar5 + 0.5) / local_c0;
      if (0.5 <= dVar26) {
        dVar26 = dVar26 * 4.0 * dVar26 + -1.0;
      }
      else {
        dVar26 = (1.0 - dVar26) * -4.0 * (1.0 - dVar26) + 1.0;
      }
      dVar26 = dVar26 * 0.3333333333333333;
      dVar27 = ((double)(int)uVar16 + 0.5) / local_c0;
      if (0.5 <= dVar27) {
        dVar27 = dVar27 * 4.0 * dVar27 + -1.0;
      }
      else {
        dVar27 = (1.0 - dVar27) * -4.0 * (1.0 - dVar27) + 1.0;
      }
      dVar27 = dVar27 * 0.3333333333333333;
      dVar25 = dVar27;
      dVar28 = dVar27;
      switch(local_d8[(long)pFVar18].face) {
      case 0:
        dVar28 = 1.0;
        break;
      case 1:
        dVar28 = -dVar26;
        dVar26 = 1.0;
        break;
      case 2:
        dVar28 = -dVar26;
        dVar26 = -dVar27;
        dVar25 = 1.0;
        break;
      case 3:
        dVar25 = -dVar26;
        dVar28 = -1.0;
        dVar26 = -dVar27;
        break;
      case 4:
        dVar25 = -dVar26;
        dVar26 = -1.0;
        break;
      default:
        dVar25 = -1.0;
      }
      uVar24 = uVar3 | uVar24;
      dVar27 = SQRT(dVar25 * dVar25 + dVar26 * dVar26 + dVar28 * dVar28);
      dVar27 = (double)(~-(ulong)(dVar27 != 0.0) & (ulong)dVar27 |
                       (ulong)(1.0 / dVar27) & -(ulong)(dVar27 != 0.0));
      pVVar23[local_a0].c_[0] = dVar28 * dVar27;
      pVVar23[local_a0].c_[1] = dVar26 * dVar27;
      pVVar23[local_a0].c_[2] = dVar27 * dVar25;
      uVar10 = local_a0 + 1;
    } while (uVar10 != uVar22);
  }
  pVVar1 = (VType *)decoder->buf_;
  pVVar11 = (VType *)decoder->limit_;
  if (pVVar1 < pVVar11) {
    pVVar12 = (VType *)((long)pVVar1 + 1);
    uVar3 = *(byte *)pVVar1 & 0x7f;
    if ((char)*(byte *)pVVar1 < '\0') {
      if (pVVar11 <= pVVar12) goto LAB_00204f5c;
      pVVar12 = (VType *)((long)pVVar1 + 2);
      uVar3 = uVar3 | (*(byte *)((long)pVVar1 + 1) & 0x7f) << 7;
      if ((char)*(byte *)((long)pVVar1 + 1) < '\0') {
        if (pVVar11 <= pVVar12) goto LAB_00204f5c;
        pVVar12 = (VType *)((long)pVVar1 + 3);
        uVar3 = uVar3 | (*(byte *)((long)pVVar1 + 2) & 0x7f) << 0xe;
        if ((char)*(byte *)((long)pVVar1 + 2) < '\0') {
          if (pVVar11 <= pVVar12) goto LAB_00204f5c;
          pVVar12 = (VType *)((long)pVVar1 + 4);
          uVar3 = uVar3 | (*(byte *)((long)pVVar1 + 3) & 0x7f) << 0x15;
          if ((char)*(byte *)((long)pVVar1 + 3) < '\0') {
            if ((pVVar11 <= pVVar12) || (0xf < *(byte *)((long)pVVar1 + 4))) goto LAB_00204f5c;
            pVVar12 = (VType *)((long)pVVar1 + 5);
            uVar3 = uVar3 | (uint)*(byte *)((long)pVVar1 + 4) << 0x1c;
          }
        }
      }
    }
    decoder->buf_ = (uchar *)pVVar12;
    if (uVar3 <= uVar22) {
      bVar14 = true;
      for (; uVar3 != 0; uVar3 = uVar3 - 1) {
        pVVar1 = (VType *)decoder->limit_;
        if (pVVar1 <= pVVar12) goto LAB_00204f5c;
        pVVar11 = (VType *)((long)pVVar12 + 1);
        uVar5 = *(byte *)pVVar12 & 0x7f;
        if ((char)*(byte *)pVVar12 < '\0') {
          if (pVVar1 <= pVVar11) goto LAB_00204f5c;
          pVVar11 = (VType *)((long)pVVar12 + 2);
          uVar5 = uVar5 | (*(byte *)((long)pVVar12 + 1) & 0x7f) << 7;
          if ((char)*(byte *)((long)pVVar12 + 1) < '\0') {
            if (pVVar1 <= pVVar11) goto LAB_00204f5c;
            pVVar11 = (VType *)((long)pVVar12 + 3);
            uVar5 = uVar5 | (*(byte *)((long)pVVar12 + 2) & 0x7f) << 0xe;
            if ((char)*(byte *)((long)pVVar12 + 2) < '\0') {
              if (pVVar1 <= pVVar11) goto LAB_00204f5c;
              pVVar11 = (VType *)((long)pVVar12 + 4);
              uVar5 = uVar5 | (*(byte *)((long)pVVar12 + 3) & 0x7f) << 0x15;
              if ((char)*(byte *)((long)pVVar12 + 3) < '\0') {
                if ((pVVar1 <= pVVar11) || (0xf < *(byte *)((long)pVVar12 + 4))) goto LAB_00204f5c;
                pVVar11 = (VType *)((long)pVVar12 + 5);
                uVar5 = uVar5 | (uint)*(byte *)((long)pVVar12 + 4) << 0x1c;
              }
            }
          }
        }
        decoder->buf_ = (uchar *)pVVar11;
        uVar24 = (ulong)uVar5;
        if (uVar22 <= uVar24) goto LAB_00204f5c;
        if (pVVar1 < pVVar11) {
          S2LogMessage::S2LogMessage
                    (&local_b0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.h"
                     ,0x1a1,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_b0.stream_,"Check failed: (limit_) >= (buf_) ",0x21);
LAB_0020502b:
          abort();
        }
        if ((ulong)((long)pVVar1 - (long)pVVar11) < 0x18) goto LAB_00204f5c;
        pVVar23[uVar24].c_[2] = pVVar11[2];
        VVar2 = pVVar11[1];
        pVVar23[uVar24].c_[0] = *pVVar11;
        pVVar23[uVar24].c_[1] = VVar2;
        pVVar12 = (VType *)(decoder->buf_ + 0x18);
        decoder->buf_ = (uchar *)pVVar12;
      }
      goto LAB_00204f5e;
    }
  }
LAB_00204f5c:
  bVar14 = false;
LAB_00204f5e:
  if (local_d8 != (pointer)0x0) {
    operator_delete(local_d8);
  }
  return bVar14;
}

Assistant:

bool S2DecodePointsCompressed(Decoder* decoder, int level,
                              Span<S2Point> points) {
  Faces faces;
  if (!faces.Decode(points.size(), decoder)) {
    return false;
  }

  NthDerivativeCoder pi_coder(kDerivativeEncodingOrder);
  NthDerivativeCoder qi_coder(kDerivativeEncodingOrder);
  Faces::Iterator faces_iterator = faces.GetIterator();
  for (int i = 0; i < points.size(); ++i) {
    pair<int, int> vertex_pi_qi;
    if (i == 0) {
      if (!DecodeFirstPointFixedLength(decoder, level, &pi_coder, &qi_coder,
                                       &vertex_pi_qi)) {
        return false;
      }
    } else {
      if (!DecodePointCompressed(decoder, level, &pi_coder, &qi_coder,
                                 &vertex_pi_qi)) {
        return false;
      }
    }

    int face = faces_iterator.Next();
    points[i] =
        FacePiQitoXYZ(face, vertex_pi_qi.first, vertex_pi_qi.second, level);
  }

  unsigned int num_off_center;
  if (!decoder->get_varint32(&num_off_center) ||
      num_off_center > points.size()) {
    return false;
  }
  for (int i = 0; i < num_off_center; ++i) {
    uint32 index;
    if (!decoder->get_varint32(&index) || index >= points.size()) {
      return false;
    }
    if (decoder->avail() < sizeof(points[index])) return false;
    decoder->getn(&points[index], sizeof(points[index]));
  }
  return true;
}